

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<pstore::command_line::list<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>>
               (list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
                *value,ostream *os)

{
  ostream *os_local;
  list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
  *value_local;
  
  ContainerPrinter::
  PrintValue<pstore::command_line::list<(anonymous_namespace)::enumeration,pstore::command_line::parser<(anonymous_namespace)::enumeration,void>>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}